

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Listen.cpp
# Opt level: O0

int __thiscall RenX_ListenPlugin::think(RenX_ListenPlugin *this)

{
  ushort uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  char *pcVar3;
  pointer pSVar4;
  undefined8 uVar5;
  unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> local_38 [3];
  unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> local_20;
  unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_> server;
  Socket *sock;
  RenX_ListenPlugin *this_local;
  
  server._M_t.super___uniq_ptr_impl<RenX::Server,_std::default_delete<RenX::Server>_>._M_t.
  super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>.
  super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl =
       (__uniq_ptr_data<RenX::Server,_std::default_delete<RenX::Server>,_true,_true>)
       Jupiter::Socket::accept();
  if ((tuple<RenX::Server_*,_std::default_delete<RenX::Server>_>)
      server._M_t.super___uniq_ptr_impl<RenX::Server,_std::default_delete<RenX::Server>_>._M_t.
      super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>.
      super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl !=
      (_Head_base<0UL,_RenX::Server_*,_false>)0x0) {
    Jupiter::Socket::setBlocking
              (server._M_t.super___uniq_ptr_impl<RenX::Server,_std::default_delete<RenX::Server>_>.
               _M_t.super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>.
               super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl._0_1_);
    std::make_unique<RenX::Server,Jupiter::Socket,std::__cxx11::string&>
              ((Socket *)&local_20,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               server._M_t.super___uniq_ptr_impl<RenX::Server,_std::default_delete<RenX::Server>_>.
               _M_t.super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>.
               super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl);
    std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>::operator->(&local_20);
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             RenX::Server::getSocketHostname_abi_cxx11_();
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (pbVar2);
    std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>::operator->(&local_20);
    uVar1 = RenX::Server::getSocketPort();
    printf("Incoming server connected from %s:%u\r\n",pcVar3,(ulong)uVar1);
    pSVar4 = std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>::operator->
                       (&local_20);
    std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>::operator->(&local_20);
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             RenX::Server::getSocketHostname_abi_cxx11_();
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (pbVar2);
    std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>::operator->(&local_20);
    uVar1 = RenX::Server::getSocketPort();
    RenX::Server::sendLogChan
              ((char *)pSVar4,"Incoming server connected from \x0312%s:%u",pcVar3,(ulong)uVar1);
    uVar5 = RenX::getCore();
    std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>::unique_ptr
              (local_38,&local_20);
    RenX::Core::addServer(uVar5,local_38);
    std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>::~unique_ptr(local_38);
    if ((__uniq_ptr_impl<RenX::Server,_std::default_delete<RenX::Server>_>)
        server._M_t.super___uniq_ptr_impl<RenX::Server,_std::default_delete<RenX::Server>_>._M_t.
        super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>.
        super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<RenX::Server,_std::default_delete<RenX::Server>_>)0x0) {
      (**(code **)(*(long *)server._M_t.
                            super___uniq_ptr_impl<RenX::Server,_std::default_delete<RenX::Server>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_RenX::Server_*,_std::default_delete<RenX::Server>_>
                            .super__Head_base<0UL,_RenX::Server_*,_false>._M_head_impl + 0x70))();
    }
    std::unique_ptr<RenX::Server,_std::default_delete<RenX::Server>_>::~unique_ptr(&local_20);
  }
  return 0;
}

Assistant:

int RenX_ListenPlugin::think() {
	Jupiter::Socket *sock = socket.accept();
	if (sock != nullptr) {
		sock->setBlocking(false);
		std::unique_ptr<RenX::Server> server = std::make_unique<RenX::Server>(std::move(*sock), RenX_ListenPlugin::serverSection);
		printf("Incoming server connected from %s:%u" ENDL, server->getSocketHostname().c_str(), server->getSocketPort());
		server->sendLogChan("Incoming server connected from " IRCCOLOR "12%s:%u", server->getSocketHostname().c_str(), server->getSocketPort());
		RenX::getCore()->addServer(std::move(server));
		delete sock;
	}
	return 0;
}